

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

size_t Assimp::IFC::CloseWindows
                 (ContourVector *contours,IfcMatrix4 *minv,OpeningRefVector *contours_to_openings,
                 TempMesh *curmesh)

{
  TempOpening *pTVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  reference pPVar5;
  iterator __first;
  size_type sVar6;
  reference this;
  size_type sVar7;
  aiVector3t<double> *paVar8;
  reference pvVar9;
  pointer pPVar10;
  reference pvVar11;
  reference pvVar12;
  reference paVar13;
  reference ppTVar14;
  aiVector2t<double> *paVar15;
  double dVar16;
  iterator iVar17;
  const_iterator cVar18;
  value_type *local_450;
  value_type *local_440;
  value_type *local_428;
  value_type *local_418;
  value_type *local_408;
  value_type *local_3f8;
  aiVector3t<double> local_358;
  aiVector3t<double> local_340;
  reference local_328;
  IfcVector2 *proj_point_1;
  const_iterator cit_1;
  TempOpening *opening_2;
  iterator __end4;
  iterator __begin4;
  OpeningRefs *__range4;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_2f0;
  const_iterator cend_1;
  IfcVector2 *local_2e0;
  const_iterator cbegin_1;
  _Bit_const_iterator local_2c8;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_2b8;
  value_type_conflict3 local_2ac;
  aiVector3t<double> local_2a8;
  double local_290;
  IfcFloat sqdist;
  IfcVector3 *other;
  const_iterator __end6;
  const_iterator __begin6;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *__range6;
  TempOpening *opening_1;
  iterator __end5;
  iterator __begin5;
  OpeningRefs *__range5;
  undefined1 local_230 [8];
  IfcVector3 world_point;
  IfcVector3 bestv;
  IfcFloat best;
  IfcVector2 *proj_point;
  const_iterator cit;
  iterator iStack_1e0;
  bool drop_this_edge;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_1d8;
  const_iterator cend;
  __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
  local_1c8;
  const_iterator cbegin;
  IfcVector3 start1;
  IfcVector3 start0;
  const_iterator skipit;
  IfcVector3 contourNormal;
  aiVector3t<double> local_150;
  ulong local_138;
  size_t a;
  undefined1 local_128 [8];
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> worldSpaceContourVtx;
  IfcVector3 basePolyNormal;
  bool reverseCountourFaces;
  _Bit_iterator local_e0;
  undefined1 local_d0 [8];
  const_iterator skipbegin;
  undefined1 local_98 [8];
  ContourRefVector adjacent_contours;
  TempOpening *opening;
  iterator __end3;
  iterator __begin3;
  OpeningRefs *__range3;
  bool has_other_side;
  OpeningRefs *refs;
  iterator end;
  iterator it;
  size_t closed;
  TempMesh *curmesh_local;
  OpeningRefVector *contours_to_openings_local;
  IfcMatrix4 *minv_local;
  ContourVector *contours_local;
  
  it._M_current = (ProjectedWindowContour *)0x0;
  end = std::
        vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ::begin(contours);
  refs = (OpeningRefs *)
         std::
         vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
         ::end(contours);
  do {
    bVar3 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                             *)&refs);
    if (!bVar3) {
      return (size_t)it._M_current;
    }
    pPVar5 = __gnu_cxx::
             __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
             ::operator*(&end);
    bVar3 = ProjectedWindowContour::IsInvalid(pPVar5);
    if (!bVar3) {
      __first = std::
                vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                ::begin(contours);
      sVar6 = std::
              distance<__gnu_cxx::__normal_iterator<Assimp::IFC::ProjectedWindowContour*,std::vector<Assimp::IFC::ProjectedWindowContour,std::allocator<Assimp::IFC::ProjectedWindowContour>>>>
                        ((__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                          )__first._M_current,
                         (__normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                          )end._M_current);
      this = std::
             vector<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>,_std::allocator<std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>_>
             ::operator[](contours_to_openings,sVar6);
      bVar3 = false;
      __end3 = std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
               ::begin(this);
      opening = (TempOpening *)
                std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                ::end(this);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                                         *)&opening), bVar4) {
        ppTVar14 = __gnu_cxx::
                   __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                   ::operator*(&__end3);
        adjacent_contours.
        super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppTVar14;
        bVar4 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                          (&((TempOpening *)
                            adjacent_contours.
                            super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->wallPoints);
        if (!bVar4) {
          bVar3 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
        ::operator++(&__end3);
      }
      if (bVar3) {
        std::
        vector<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
        ::vector((vector<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
                  *)local_98);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        ProjectedWindowContour::PrepareSkiplist(pPVar5);
        FindAdjacentContours(end,contours);
        FindBorderContours(end);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        if ((pPVar5->is_rectangular & 1U) != 0) {
          skipbegin.super__Bit_iterator_base._8_8_ = end._M_current;
          FindLikelyCrossingLines(end);
        }
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        sVar6 = std::vector<bool,_std::allocator<bool>_>::size(&pPVar5->skiplist);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        sVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                          (&pPVar5->contour);
        if (sVar6 != sVar7) {
          __assert_fail("(*it).skiplist.size() == (*it).contour.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                        ,0x386,
                        "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                       );
        }
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        iVar17 = std::vector<bool,_std::allocator<bool>_>::begin(&pPVar5->skiplist);
        local_e0.super__Bit_iterator_base._M_p = iVar17.super__Bit_iterator_base._M_p;
        local_e0.super__Bit_iterator_base._M_offset = iVar17.super__Bit_iterator_base._M_offset;
        std::_Bit_const_iterator::_Bit_const_iterator((_Bit_const_iterator *)local_d0,&local_e0);
        sVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                          (&curmesh->mVerts);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        sVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                          (&pPVar5->contour);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                  (&curmesh->mVerts,sVar6 + sVar7 * 4);
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&curmesh->mVertcnt);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        sVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                          (&pPVar5->contour);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  (&curmesh->mVertcnt,sVar6 + sVar7);
        basePolyNormal.z._7_1_ = false;
        sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&curmesh->mVertcnt);
        if (sVar6 != 0) {
          paVar8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::data
                             (&curmesh->mVerts);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
                             (&curmesh->mVertcnt);
          TempMesh::ComputePolygonNormal
                    ((IfcVector3 *)
                     &worldSpaceContourVtx.
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,paVar8,(ulong)*pvVar9,true);
          pPVar10 = __gnu_cxx::
                    __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                    ::operator->(&end);
          sVar6 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                            (&pPVar10->contour);
          std::allocator<aiVector3t<double>_>::allocator
                    ((allocator<aiVector3t<double>_> *)((long)&a + 7));
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_128,
                     sVar6,(allocator<aiVector3t<double>_> *)((long)&a + 7));
          std::allocator<aiVector3t<double>_>::~allocator
                    ((allocator<aiVector3t<double>_> *)((long)&a + 7));
          local_138 = 0;
          while( true ) {
            uVar2 = local_138;
            pPVar10 = __gnu_cxx::
                      __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                      ::operator->(&end);
            sVar6 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                              (&pPVar10->contour);
            if (sVar6 <= uVar2) break;
            pPVar10 = __gnu_cxx::
                      __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                      ::operator->(&end);
            pvVar11 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                      operator[](&pPVar10->contour,local_138);
            dVar16 = pvVar11->x;
            pPVar10 = __gnu_cxx::
                      __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                      ::operator->(&end);
            pvVar11 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                      operator[](&pPVar10->contour,local_138);
            aiVector3t<double>::aiVector3t
                      ((aiVector3t<double> *)&contourNormal.z,dVar16,pvVar11->y,0.0);
            ::operator*(&local_150,minv,(aiVector3t<double> *)&contourNormal.z);
            pvVar12 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                      operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )local_128,local_138);
            pvVar12->x = local_150.x;
            pvVar12->y = local_150.y;
            pvVar12->z = local_150.z;
            local_138 = local_138 + 1;
          }
          paVar8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::data
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                              local_128);
          sVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             local_128);
          TempMesh::ComputePolygonNormal
                    ((IfcVector3 *)&skipit.super__Bit_iterator_base._M_offset,paVar8,sVar6,true);
          dVar16 = ::operator*((aiVector3t<double> *)&skipit.super__Bit_iterator_base._M_offset,
                               (aiVector3t<double> *)
                               &worldSpaceContourVtx.
                                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          basePolyNormal.z._7_1_ = 0.0 < dVar16;
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)local_128);
        }
        start0.z = (double)local_d0;
        skipit.super__Bit_iterator_base._M_p = skipbegin.super__Bit_iterator_base._M_p;
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)&start1.z);
        aiVector3t<double>::aiVector3t((aiVector3t<double> *)&cbegin);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        cend._M_current =
             (aiVector2t<double> *)
             std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                       (&pPVar5->contour);
        __gnu_cxx::
        __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
        ::__normal_iterator<aiVector2t<double>*>
                  ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                    *)&local_1c8,
                   (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                    *)&cend);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        iStack_1e0 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end
                               (&pPVar5->contour);
        __gnu_cxx::
        __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
        ::__normal_iterator<aiVector2t<double>*>
                  ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                    *)&local_1d8,&stack0xfffffffffffffe20);
        cit._M_current._7_1_ = false;
        proj_point = local_1c8._M_current;
        while (bVar3 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                   *)&proj_point,&local_1d8), bVar3) {
          paVar13 = __gnu_cxx::
                    __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                    ::operator*((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                 *)&proj_point);
          bestv.z = 10000000000.0;
          aiVector3t<double>::aiVector3t((aiVector3t<double> *)&world_point.z);
          aiVector3t<double>::aiVector3t((aiVector3t<double> *)&__range5,paVar13->x,paVar13->y,0.0);
          ::operator*((aiVector3t<double> *)local_230,minv,(aiVector3t<double> *)&__range5);
          __end5 = std::
                   vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
                   begin(this);
          opening_1 = (TempOpening *)
                      std::
                      vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                      ::end(this);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                                             *)&opening_1), bVar3) {
            ppTVar14 = __gnu_cxx::
                       __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                       ::operator*(&__end5);
            pTVar1 = *ppTVar14;
            __end6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                               (&pTVar1->wallPoints);
            other = (IfcVector3 *)
                    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                              (&pTVar1->wallPoints);
            while (bVar3 = __gnu_cxx::operator!=
                                     (&__end6,(__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                               *)&other), bVar3) {
              sqdist = (IfcFloat)
                       __gnu_cxx::
                       __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                       ::operator*(&__end6);
              ::operator-(&local_2a8,(aiVector3t<double> *)local_230,(aiVector3t<double> *)sqdist);
              local_290 = aiVector3t<double>::SquareLength(&local_2a8);
              if ((local_290 < bestv.z) && (1e-05 <= local_290)) {
                world_point.z = *(double *)sqdist;
                bestv.x = *(double *)((long)sqdist + 8);
                bestv.y = *(double *)((long)sqdist + 0x10);
                bestv.z = local_290;
              }
              __gnu_cxx::
              __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
              ::operator++(&__end6);
            }
            __gnu_cxx::
            __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
            ::operator++(&__end5);
          }
          if ((cit._M_current._7_1_ & 1) == 0) {
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                *)&proj_point,&local_1c8);
            if (bVar3 == basePolyNormal.z._7_1_) {
              local_3f8 = (value_type *)&world_point.z;
            }
            else {
              local_3f8 = (value_type *)local_230;
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,local_3f8);
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                *)&proj_point,&local_1c8);
            if (bVar3 == basePolyNormal.z._7_1_) {
              local_408 = (value_type *)local_230;
            }
            else {
              local_408 = (value_type *)&world_point.z;
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,local_408);
            local_2ac = 4;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&curmesh->mVertcnt,&local_2ac);
            it._M_current =
                 (ProjectedWindowContour *)
                 ((long)&((it._M_current)->contour).
                         super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1);
          }
          else {
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                      (&curmesh->mVerts);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                      (&curmesh->mVerts);
          }
          bVar3 = __gnu_cxx::operator==
                            ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                              *)&proj_point,&local_1c8);
          if (bVar3) {
            start1.z = (double)local_230;
            start0.x = world_point.x;
            start0.y = world_point.y;
            cbegin._M_current = (aiVector2t<double> *)world_point.z;
            start1.x = bestv.x;
            start1.y = bestv.y;
          }
          else {
            if (basePolyNormal.z._7_1_ == false) {
              local_418 = (value_type *)local_230;
            }
            else {
              local_418 = (value_type *)&world_point.z;
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,local_418);
            if (basePolyNormal.z._7_1_ == false) {
              local_428 = (value_type *)&world_point.z;
            }
            else {
              local_428 = (value_type *)local_230;
            }
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      (&curmesh->mVerts,local_428);
            local_2b8 = __gnu_cxx::
                        __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                        ::operator-(&local_1d8,1);
            bVar3 = __gnu_cxx::operator==
                              ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                *)&proj_point,&local_2b8);
            if (bVar3) {
              cit._M_current._7_1_ =
                   std::_Bit_const_iterator::operator*((_Bit_const_iterator *)&start0.z);
              if ((bool)cit._M_current._7_1_) {
                it._M_current = (ProjectedWindowContour *)&it._M_current[-1].field_0x67;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                          (&curmesh->mVertcnt);
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                          (&curmesh->mVerts);
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::pop_back
                          (&curmesh->mVerts);
              }
              else {
                if (basePolyNormal.z._7_1_ == false) {
                  local_440 = (value_type *)&cbegin;
                }
                else {
                  local_440 = (value_type *)&start1.z;
                }
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                          (&curmesh->mVerts,local_440);
                if (basePolyNormal.z._7_1_ == false) {
                  local_450 = (value_type *)&start1.z;
                }
                else {
                  local_450 = (value_type *)&cbegin;
                }
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                          (&curmesh->mVerts,local_450);
              }
            }
          }
          __gnu_cxx::
          __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
          ::operator++((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                        *)&proj_point);
          cVar18 = std::_Bit_const_iterator::operator++((_Bit_const_iterator *)&start0.z,0);
          cbegin_1._M_current = (aiVector2t<double> *)cVar18.super__Bit_iterator_base._M_p;
          local_2c8.super__Bit_iterator_base._M_offset = cVar18.super__Bit_iterator_base._M_offset;
          local_2c8.super__Bit_iterator_base._M_p = (_Bit_type *)cbegin_1._M_current;
          cit._M_current._7_1_ = std::_Bit_const_iterator::operator*(&local_2c8);
        }
        std::
        vector<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
        ::~vector((vector<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>,___gnu_cxx::__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>_>_>_>
                   *)local_98);
      }
      else {
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        cend_1._M_current =
             (aiVector2t<double> *)
             std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::begin
                       (&pPVar5->contour);
        __gnu_cxx::
        __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
        ::__normal_iterator<aiVector2t<double>*>
                  ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                    *)&local_2e0,
                   (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                    *)&cend_1);
        pPVar5 = __gnu_cxx::
                 __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                 ::operator*(&end);
        __range4 = (OpeningRefs *)
                   std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::end
                             (&pPVar5->contour);
        __gnu_cxx::
        __normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
        ::__normal_iterator<aiVector2t<double>*>
                  ((__normal_iterator<aiVector2t<double>const*,std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>>
                    *)&local_2f0,
                   (__normal_iterator<aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                    *)&__range4);
        __end4 = std::
                 vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>::
                 begin(this);
        opening_2 = (TempOpening *)
                    std::
                    vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>
                    ::end(this);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                                           *)&opening_2), bVar3) {
          ppTVar14 = __gnu_cxx::
                     __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
                     ::operator*(&__end4);
          cit_1._M_current = (aiVector2t<double> *)*ppTVar14;
          bVar3 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                            (&((TempOpening *)cit_1._M_current)->wallPoints);
          if (!bVar3) {
            __assert_fail("opening->wallPoints.empty()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCOpenings.cpp"
                          ,0x3ec,
                          "size_t Assimp::IFC::CloseWindows(ContourVector &, const IfcMatrix4 &, OpeningRefVector &, TempMesh &)"
                         );
          }
          paVar15 = cit_1._M_current + 4;
          sVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::capacity
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             (cit_1._M_current + 4));
          pPVar5 = __gnu_cxx::
                   __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                   ::operator*(&end);
          sVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                            (&pPVar5->contour);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)paVar15,
                     sVar6 + sVar7);
          proj_point_1 = local_2e0;
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                     *)&proj_point_1,&local_2f0), bVar3) {
            local_328 = __gnu_cxx::
                        __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                        ::operator*((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                                     *)&proj_point_1);
            paVar15 = cit_1._M_current + 4;
            aiVector3t<double>::aiVector3t(&local_358,local_328->x,local_328->y,0.0);
            ::operator*(&local_340,minv,&local_358);
            std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                      ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)paVar15,
                       &local_340);
            __gnu_cxx::
            __normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
            ::operator++((__normal_iterator<const_aiVector2t<double>_*,_std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>_>
                          *)&proj_point_1);
          }
          __gnu_cxx::
          __normal_iterator<Assimp::IFC::TempOpening_**,_std::vector<Assimp::IFC::TempOpening_*,_std::allocator<Assimp::IFC::TempOpening_*>_>_>
          ::operator++(&__end4);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

size_t CloseWindows(ContourVector& contours,
    const IfcMatrix4& minv,
    OpeningRefVector& contours_to_openings,
    TempMesh& curmesh)
{
    size_t closed = 0;
    // For all contour points, check if one of the assigned openings does
    // already have points assigned to it. In this case, assume this is
    // the other side of the wall and generate connections between
    // the two holes in order to close the window.

    // All this gets complicated by the fact that contours may pertain to
    // multiple openings(due to merging of adjacent or overlapping openings).
    // The code is based on the assumption that this happens symmetrically
    // on both sides of the wall. If it doesn't (which would be a bug anyway)
    // wrong geometry may be generated.
    for (ContourVector::iterator it = contours.begin(), end = contours.end(); it != end; ++it) {
        if ((*it).IsInvalid()) {
            continue;
        }
        OpeningRefs& refs = contours_to_openings[std::distance(contours.begin(), it)];

        bool has_other_side = false;
        for(const TempOpening* opening : refs) {
            if(!opening->wallPoints.empty()) {
                has_other_side = true;
                break;
            }
        }

        if (has_other_side) {

            ContourRefVector adjacent_contours;

            // prepare a skiplist for this contour. The skiplist is used to
            // eliminate unwanted contour lines for adjacent windows and
            // those bordering the outer frame.
            (*it).PrepareSkiplist();

            FindAdjacentContours(it, contours);
            FindBorderContours(it);

            // if the window is the result of a finite union or intersection of rectangles,
            // there shouldn't be any crossing or diagonal lines in it. Such lines would
            // be artifacts caused by numerical inaccuracies or other bugs in polyclipper
            // and our own code. Since rectangular openings are by far the most frequent
            // case, it is worth filtering for this corner case.
            if((*it).is_rectangular) {
                FindLikelyCrossingLines(it);
            }

            ai_assert((*it).skiplist.size() == (*it).contour.size());

            SkipList::const_iterator skipbegin = (*it).skiplist.begin();

            curmesh.mVerts.reserve(curmesh.mVerts.size() + (*it).contour.size() * 4);
            curmesh.mVertcnt.reserve(curmesh.mVertcnt.size() + (*it).contour.size());

			bool reverseCountourFaces = false;

            // compare base poly normal and contour normal to detect if we need to reverse the face winding
			if(curmesh.mVertcnt.size() > 0) {
				IfcVector3 basePolyNormal = TempMesh::ComputePolygonNormal(curmesh.mVerts.data(), curmesh.mVertcnt.front());
				
				std::vector<IfcVector3> worldSpaceContourVtx(it->contour.size());
				
				for(size_t a = 0; a < it->contour.size(); ++a)
					worldSpaceContourVtx[a] = minv * IfcVector3(it->contour[a].x, it->contour[a].y, 0.0);
				
				IfcVector3 contourNormal = TempMesh::ComputePolygonNormal(worldSpaceContourVtx.data(), worldSpaceContourVtx.size());
				
				reverseCountourFaces = (contourNormal * basePolyNormal) > 0.0;
			}

            // XXX this algorithm is really a bit inefficient - both in terms
            // of constant factor and of asymptotic runtime.
            std::vector<bool>::const_iterator skipit = skipbegin;

            IfcVector3 start0;
            IfcVector3 start1;

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();

            bool drop_this_edge = false;
            for (Contour::const_iterator cit = cbegin; cit != cend; ++cit, drop_this_edge = *skipit++) {
                const IfcVector2& proj_point = *cit;

                // Locate the closest opposite point. This should be a good heuristic to
                // connect only the points that are really intended to be connected.
                IfcFloat best = static_cast<IfcFloat>(1e10);
                IfcVector3 bestv;

                const IfcVector3 world_point = minv * IfcVector3(proj_point.x,proj_point.y,0.0f);

                for(const TempOpening* opening : refs) {
                    for(const IfcVector3& other : opening->wallPoints) {
                        const IfcFloat sqdist = (world_point - other).SquareLength();

                        if (sqdist < best) {
                            // avoid self-connections
                            if(sqdist < 1e-5) {
                                continue;
                            }

                            bestv = other;
                            best = sqdist;
                        }
                    }
                }

                if (drop_this_edge) {
                    curmesh.mVerts.pop_back();
                    curmesh.mVerts.pop_back();
                }
                else {
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? world_point : bestv);
                    curmesh.mVerts.push_back(((cit == cbegin) != reverseCountourFaces) ? bestv : world_point);

                    curmesh.mVertcnt.push_back(4);
                    ++closed;
                }

                if (cit == cbegin) {
                    start0 = world_point;
                    start1 = bestv;
                    continue;
                }

                curmesh.mVerts.push_back(reverseCountourFaces ? bestv : world_point);
                curmesh.mVerts.push_back(reverseCountourFaces ? world_point : bestv);

                if (cit == cend - 1) {
                    drop_this_edge = *skipit;

                    // Check if the final connection (last to first element) is itself
                    // a border edge that needs to be dropped.
                    if (drop_this_edge) {
                        --closed;
                        curmesh.mVertcnt.pop_back();
                        curmesh.mVerts.pop_back();
                        curmesh.mVerts.pop_back();
                    }
                    else {
                        curmesh.mVerts.push_back(reverseCountourFaces ? start0 : start1);
                        curmesh.mVerts.push_back(reverseCountourFaces ? start1 : start0);
                    }
                }
            }
        }
        else {

            const Contour::const_iterator cbegin = (*it).contour.begin(), cend = (*it).contour.end();
            for(TempOpening* opening : refs) {
                ai_assert(opening->wallPoints.empty());
                opening->wallPoints.reserve(opening->wallPoints.capacity() + (*it).contour.size());
                for (Contour::const_iterator cit = cbegin; cit != cend; ++cit) {

                    const IfcVector2& proj_point = *cit;
                    opening->wallPoints.push_back(minv * IfcVector3(proj_point.x,proj_point.y,0.0f));
                }
            }
        }
    }
    return closed;
}